

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_sink_test.cc
# Opt level: O0

void __thiscall
google::protobuf::io::zc_sink_internal::anon_unknown_0::ZeroCopyStreamByteSinkTest_WriteShort_Test::
TestBody(ZeroCopyStreamByteSinkTest_WriteShort_Test *this)

{
  bool bVar1;
  const_pointer bytes;
  size_type len;
  char *message;
  string_view sVar2;
  AssertHelper local_1e8;
  Message local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_1a8 [8];
  string_view chunk;
  ScopedTrace local_171;
  undefined1 local_170 [7];
  ScopedTrace gtest_trace_167;
  ZeroCopyStreamByteSink byte_sink;
  undefined1 local_118 [8];
  PatternedOutputStream output_stream;
  string local_a8;
  ScopedTrace local_81;
  undefined1 auStack_80 [7];
  ScopedTrace gtest_trace_163;
  undefined1 local_70 [8];
  ChunkedString input;
  string local_38;
  ScopedTrace local_11;
  ZeroCopyStreamByteSinkTest_WriteShort_Test *pZStack_10;
  ScopedTrace gtest_trace_159;
  ZeroCopyStreamByteSinkTest_WriteShort_Test *this_local;
  
  pZStack_10 = this;
  do {
    zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
              (&local_38,&(this->super_ZeroCopyStreamByteSinkTest).output_chunks_);
    testing::ScopedTrace::ScopedTrace
              (&local_11,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
               ,0x9f,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_80,"012345678");
    ChunkedString::ChunkedString((ChunkedString *)local_70,_auStack_80,1);
    do {
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                (&local_a8,local_70);
      testing::ScopedTrace::ScopedTrace
                (&local_81,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xa3,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      output_stream.byte_count_ = 0;
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[8] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[9] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[0] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[1] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[2] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[3] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[4] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[5] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[6] = '\0';
      (this->super_ZeroCopyStreamByteSinkTest).output_._M_elems[7] = '\0';
      PatternedOutputStream::PatternedOutputStream
                ((PatternedOutputStream *)local_118,
                 (this->super_ZeroCopyStreamByteSinkTest).output_chunks_);
      ZeroCopyStreamByteSink::ZeroCopyStreamByteSink
                ((ZeroCopyStreamByteSink *)local_170,(ZeroCopyOutputStream *)local_118);
      zc_sink_internal::(anonymous_namespace)::ChunkedString::PatternAsQuotedString_abi_cxx11_
                ((string *)&chunk._M_str,local_70);
      testing::ScopedTrace::ScopedTrace
                (&local_171,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xa7,(string *)&chunk._M_str);
      std::__cxx11::string::~string((string *)&chunk._M_str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8);
      while( true ) {
        sVar2 = ChunkedString::NextChunk((ChunkedString *)local_70);
        chunk._M_len = (size_t)sVar2._M_str;
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )sVar2._M_len;
        local_1a8 = (undefined1  [8])
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        bytes = std::basic_string_view<char,_std::char_traits<char>_>::data
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8);
        len = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8);
        ZeroCopyStreamByteSink::Append((ZeroCopyStreamByteSink *)local_170,bytes,len);
      }
      testing::ScopedTrace::~ScopedTrace(&local_171);
      ZeroCopyStreamByteSink::~ZeroCopyStreamByteSink((ZeroCopyStreamByteSink *)local_170);
      PatternedOutputStream::~PatternedOutputStream((PatternedOutputStream *)local_118);
      testing::ScopedTrace::~ScopedTrace(&local_81);
      bVar1 = ChunkedString::NextPattern((ChunkedString *)local_70);
    } while (bVar1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d8,"012345678",10);
    testing::internal::EqHelper::
    Compare<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              ((EqHelper *)local_1c8,"output_view_","absl::string_view(\"012345678\\0\", 10)",
               &(this->super_ZeroCopyStreamByteSinkTest).output_view_,&local_1d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1e0);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_1e8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_sink_test.cc"
                 ,0xae,message);
      testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1e8);
      testing::Message::~Message(&local_1e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    testing::ScopedTrace::~ScopedTrace(&local_11);
  } while ((bVar1) &&
          (bVar1 = ChunkedString::NextPattern
                             (&(this->super_ZeroCopyStreamByteSinkTest).output_chunks_), bVar1));
  return;
}

Assistant:

TEST_F(ZeroCopyStreamByteSinkTest, WriteShort) {
  do {
    SCOPED_TRACE(output_chunks_.PatternAsQuotedString());
    ChunkedString input("012345678", 1);

    do {
      SCOPED_TRACE(input.PatternAsQuotedString());
      output_ = {};
      PatternedOutputStream output_stream(output_chunks_);
      ZeroCopyStreamByteSink byte_sink(&output_stream);
      SCOPED_TRACE(input.PatternAsQuotedString());
      absl::string_view chunk;
      while (!(chunk = input.NextChunk()).empty()) {
        byte_sink.Append(chunk.data(), chunk.size());
      }
    } while (input.NextPattern());

    ASSERT_EQ(output_view_, absl::string_view("012345678\0", 10));
  } while (output_chunks_.NextPattern());
}